

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void anon_unknown.dwarf_856b6::AssertUint64Fails(char *s)

{
  size_t sVar1;
  Message *message;
  char *message_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  char *s_local;
  AssertionResult gtest_ar;
  uint64_t actual_bits;
  
  local_40.ptr_._0_4_ = 1;
  s_local = s;
  sVar1 = strlen(s);
  local_38.data_._0_4_ = wabt::ParseUint64(s,s + sVar1,&actual_bits);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&gtest_ar,"Result::Error","ParseUint64(s, s + strlen(s), &actual_bits)",
             (Enum *)&local_40,(Result *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    message = testing::Message::operator<<((Message *)&local_40,&s_local);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
               ,0x96,message_00);
    testing::internal::AssertHelper::operator=(&local_38,message);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void AssertUint64Fails(const char* s) {
  uint64_t actual_bits;
  ASSERT_EQ(Result::Error, ParseUint64(s, s + strlen(s), &actual_bits)) << s;
}